

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syncprod.cc
# Opt level: O1

state_status_t
tchecker::syncprod::next
          (system_t *system,vloc_sptr_t *vloc,vedge_sptr_t *vedge,sync_id_t *sync_id,
          outgoing_edges_value_t *sync_edges)

{
  uint uVar1;
  uint uVar2;
  make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *pmVar3;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar4;
  bool bVar5;
  invalid_argument *piVar6;
  char *pcVar7;
  ulong uVar8;
  edges_iterator_t __begin2;
  edges_iterator_t __end2;
  uint *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  edges_iterator_t local_70;
  edges_iterator_t local_50;
  
  if (vloc->_t == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) {
    pcVar7 = 
    "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t>>::operator->() const [T = tchecker::make_shared_t<tchecker::vloc_t>]"
    ;
  }
  else {
    pmVar3 = vedge->_t;
    if (pmVar3 != (make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *)0x0) {
      uVar1 = (vloc->_t->super_vloc_t).super_loc_array_t.super_vloc_base_t.
              super_array_capacity_t<unsigned_int>._capacity;
      if (uVar1 != (pmVar3->super_vedge_t).super_edge_array_t.super_vedge_base_t.
                   super_array_capacity_t<unsigned_int>._capacity) {
        piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar6,"incompatible vloc and vedge");
        __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      if ((ulong)uVar1 != 0) {
        uVar8 = 0;
        do {
          if ((pmVar3->super_vedge_t).super_edge_array_t.super_vedge_base_t.
              super_array_capacity_t<unsigned_int>._capacity <= uVar8) goto LAB_0017042d;
          (&(pmVar3->super_vedge_t).super_edge_array_t._fam)[uVar8] =
               (no_storage_array_t<unsigned_int>)0xffffffff;
          uVar8 = uVar8 + 1;
        } while (uVar1 != uVar8);
      }
      local_70._async_edge.
      super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (sync_edges->edges)._begin._async_edge.
           super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_70._async_edge.
      super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (sync_edges->edges)._begin._async_edge.
              super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_70._async_edge.
          super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_70._async_edge.
           super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_70._async_edge.
                super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_70._async_edge.
           super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_70._async_edge.
                super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_70._async_at_end = (sync_edges->edges)._begin._async_at_end;
      local_70._17_7_ = *(undefined7 *)&(sync_edges->edges)._begin.field_0x11;
      local_70._sync_it._it._M_current =
           (iterator)(sync_edges->edges)._begin._sync_it._it._M_current;
      local_50._async_edge.
      super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (sync_edges->edges)._end._async_edge.
           super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_50._async_edge.
      super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (sync_edges->edges)._end._async_edge.
              super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_50._async_edge.
          super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50._async_edge.
           super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_50._async_edge.
                super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_50._async_edge.
           super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_50._async_edge.
                super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_50._async_at_end = (sync_edges->edges)._end._async_at_end;
      local_50._17_7_ = *(undefined7 *)&(sync_edges->edges)._end.field_0x11;
      local_50._sync_it._it._M_current = (iterator)(sync_edges->edges)._end._sync_it._it._M_current;
      do {
        bVar5 = edges_iterator_t::operator!=(&local_70,&local_50);
        if (!bVar5) {
          if (local_50._async_edge.
              super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50._async_edge.
                       super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_70._async_edge.
              super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70._async_edge.
                       super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
LAB_0017040b:
          *sync_id = sync_edges->sync_id;
          return 1;
        }
        edges_iterator_t::operator*(&local_70);
        uVar2 = *local_88;
        if (uVar1 <= uVar2) {
          piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar6,"incompatible edges");
          __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        pmVar4 = vloc->_t;
        if (pmVar4 == (make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *)0x0) {
          pcVar7 = 
          "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::vloc_t>]"
          ;
LAB_001704c1:
          __assert_fail("_t != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                        ,0x1d0,pcVar7);
        }
        if ((pmVar4->super_vloc_t).super_loc_array_t.super_vloc_base_t.
            super_array_capacity_t<unsigned_int>._capacity <= uVar2) {
          pcVar7 = 
          "T &tchecker::make_array_t<unsigned int, 4, tchecker::vloc_base_t>::operator[](typename BASE::capacity_t) [T = unsigned int, T_ALLOCSIZE = 4, BASE = tchecker::vloc_base_t]"
          ;
          goto LAB_00170470;
        }
        if ((&(pmVar4->super_vloc_t).super_loc_array_t._fam)[uVar2] !=
            *(no_storage_array_t<unsigned_int> *)(local_88 + 2)) {
          if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
          }
          if (local_50._async_edge.
              super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50._async_edge.
                       super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_70._async_edge.
              super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70._async_edge.
                       super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (bVar5) {
            return 2;
          }
          goto LAB_0017040b;
        }
        (&(pmVar4->super_vloc_t).super_loc_array_t._fam)[uVar2] =
             *(no_storage_array_t<unsigned_int> *)(local_88 + 3);
        pmVar3 = vedge->_t;
        if (pmVar3 == (make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL> *)0x0) {
          pcVar7 = 
          "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::vedge_t>]"
          ;
          goto LAB_001704c1;
        }
        if ((pmVar3->super_vedge_t).super_edge_array_t.super_vedge_base_t.
            super_array_capacity_t<unsigned_int>._capacity <= *local_88) goto LAB_0017042d;
        (&(pmVar3->super_vedge_t).super_edge_array_t._fam)[*local_88] =
             *(no_storage_array_t<unsigned_int> *)(local_88 + 1);
        if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
        }
        edges_iterator_t::operator++(&local_70);
      } while( true );
    }
    pcVar7 = 
    "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t>>::operator->() const [T = tchecker::make_shared_t<tchecker::vedge_t>]"
    ;
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1db,pcVar7);
LAB_0017042d:
  pcVar7 = 
  "T &tchecker::make_array_t<unsigned int, 4, tchecker::vedge_base_t>::operator[](typename BASE::capacity_t) [T = unsigned int, T_ALLOCSIZE = 4, BASE = tchecker::vedge_base_t]"
  ;
LAB_00170470:
  __assert_fail("i < BASE::_capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/array.hh"
                ,0xf1,pcVar7);
}

Assistant:

tchecker::state_status_t next(tchecker::syncprod::system_t const & system, tchecker::vloc_sptr_t const & vloc,
                              tchecker::vedge_sptr_t const & vedge, tchecker::sync_id_t & sync_id,
                              tchecker::syncprod::outgoing_edges_value_t const & sync_edges)
{
  auto size = vloc->size();
  if (size != vedge->size())
    throw std::invalid_argument("incompatible vloc and vedge");

  for (tchecker::process_id_t pid = 0; pid < size; ++pid)
    (*vedge)[pid] = tchecker::NO_EDGE;

  for (tchecker::system::edge_const_shared_ptr_t const & edge : sync_edges.edges) {
    if (edge->pid() >= size)
      throw std::invalid_argument("incompatible edges");
    if ((*vloc)[edge->pid()] != edge->src())
      return tchecker::STATE_INCOMPATIBLE_EDGE;
    (*vloc)[edge->pid()] = edge->tgt();
    (*vedge)[edge->pid()] = edge->id();
  }

  sync_id = sync_edges.sync_id;

  return tchecker::STATE_OK;
}